

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stats.cpp
# Opt level: O1

void __thiscall pbrt::PixelStatsAccumulator::PixelStatsAccumulator(PixelStatsAccumulator *this)

{
  PixelStats *pPVar1;
  memory_resource *pmVar2;
  memory_resource *pmVar3;
  
  this->stats = (PixelStats *)0x0;
  pPVar1 = (PixelStats *)operator_new(0x178);
  pmVar2 = pstd::pmr::new_delete_resource();
  (pPVar1->time).format = U256;
  (pPVar1->time).resolution.super_Tuple2<pbrt::Point2,_int>.x = 0;
  (pPVar1->time).resolution.super_Tuple2<pbrt::Point2,_int>.y = 0;
  pmVar3 = pstd::pmr::new_delete_resource();
  (pPVar1->time).channelNames.alloc.memoryResource = pmVar3;
  (pPVar1->time).channelNames.ptr =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  (pPVar1->time).channelNames.nAlloc = 0;
  (pPVar1->time).channelNames.nStored = 0;
  (pPVar1->time).encoding.
  super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>.
  bits = 0;
  (pPVar1->time).p8.alloc.memoryResource = pmVar2;
  (pPVar1->time).p8.ptr = (uchar *)0x0;
  (pPVar1->time).p8.nAlloc = 0;
  (pPVar1->time).p8.nStored = 0;
  (pPVar1->time).p16.alloc.memoryResource = pmVar2;
  (pPVar1->time).p16.ptr = (Half *)0x0;
  (pPVar1->time).p16.nAlloc = 0;
  (pPVar1->time).p16.nStored = 0;
  (pPVar1->time).p32.alloc.memoryResource = pmVar2;
  *(undefined1 (*) [64])&(pPVar1->time).p32.ptr = ZEXT464(0) << 0x40;
  *(undefined1 (*) [64])
   &(pPVar1->counterImages).super__Vector_base<pbrt::Image,_std::allocator<pbrt::Image>_>._M_impl.
    super__Vector_impl_data._M_finish = ZEXT464(0) << 0x40;
  this->stats = pPVar1;
  return;
}

Assistant:

PixelStatsAccumulator::PixelStatsAccumulator() {
    stats = new PixelStats;
}